

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::EnumFieldGenerator::GenerateCFunctionImplementations
          (EnumFieldGenerator *this,Printer *printer)

{
  if (*(int *)(*(long *)((this->super_SingleFieldGenerator).super_FieldGenerator.descriptor_ + 0x28)
              + 0x3c) == 3) {
    io::Printer::Print(printer,&(this->super_SingleFieldGenerator).super_FieldGenerator.variables_,
                       "int32_t $owning_message_class$_$capitalized_name$_RawValue($owning_message_class$ *message) {\n  GPBDescriptor *descriptor = [$owning_message_class$ descriptor];\n  GPBFieldDescriptor *field = [descriptor fieldWithNumber:$field_number_name$];\n  return GPBGetMessageInt32Field(message, field);\n}\n\nvoid Set$owning_message_class$_$capitalized_name$_RawValue($owning_message_class$ *message, int32_t value) {\n  GPBDescriptor *descriptor = [$owning_message_class$ descriptor];\n  GPBFieldDescriptor *field = [descriptor fieldWithNumber:$field_number_name$];\n  GPBSetInt32IvarWithFieldInternal(message, field, value, descriptor.file.syntax);\n}\n\n"
                      );
    return;
  }
  return;
}

Assistant:

void EnumFieldGenerator::GenerateCFunctionImplementations(
    io::Printer* printer) const {
  if (!HasPreservingUnknownEnumSemantics(descriptor_->file())) return;

  printer->Print(
      variables_,
      "int32_t $owning_message_class$_$capitalized_name$_RawValue($owning_message_class$ *message) {\n"
      "  GPBDescriptor *descriptor = [$owning_message_class$ descriptor];\n"
      "  GPBFieldDescriptor *field = [descriptor fieldWithNumber:$field_number_name$];\n"
      "  return GPBGetMessageInt32Field(message, field);\n"
      "}\n"
      "\n"
      "void Set$owning_message_class$_$capitalized_name$_RawValue($owning_message_class$ *message, int32_t value) {\n"
      "  GPBDescriptor *descriptor = [$owning_message_class$ descriptor];\n"
      "  GPBFieldDescriptor *field = [descriptor fieldWithNumber:$field_number_name$];\n"
      "  GPBSetInt32IvarWithFieldInternal(message, field, value, descriptor.file.syntax);\n"
      "}\n"
      "\n");
}